

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.h
# Opt level: O1

size_t __thiscall axl::io::psx::Socket::sendTo(Socket *this,void *p,size_t size,sockaddr *addr)

{
  int __fd;
  size_t sVar1;
  ssize_t sVar2;
  
  __fd = (this->super_File).super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h;
  sVar1 = getSockAddrFamilySize((uint)addr->sa_family);
  sVar2 = sendto(__fd,p,size,0,(sockaddr *)addr,(socklen_t)sVar1);
  if ((int)sVar2 == -1) {
    err::setLastSystemError();
  }
  return (long)(int)sVar2;
}

Assistant:

size_t
	sendTo(
		void* p,
		size_t size,
		const sockaddr* addr
	) {
		int result = ::sendto(m_h, p, size, 0, addr, getSockAddrSize(addr));
		return err::complete(result, -1);
	}